

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cc
# Opt level: O0

void __thiscall
re2c::Skeleton::Skeleton
          (Skeleton *this,dfa_t *dfa,charset_t *cs,rules_t *rs,string *dfa_name,string *dfa_cond,
          uint32_t dfa_line)

{
  uint uVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  byte bVar4;
  unsigned_short uVar5;
  size_type sVar6;
  ulong uVar7;
  ulong uVar8;
  ulong *puVar9;
  const_reference ppdVar10;
  const_reference __y;
  size_type sVar11;
  reference pvVar12;
  undefined8 uVar13;
  uint *puVar14;
  Node *pNVar15;
  ulong uVar16;
  bool bVar17;
  pair<re2c::Node_*,_unsigned_int> pVar18;
  Node *local_178;
  Node *local_140;
  uint32_t local_f0;
  uint32_t max;
  uint local_e8;
  rule_rank_t r;
  uint32_t i_1;
  uint32_t maxrule;
  uint32_t local_bc;
  Node *pNStack_b8;
  uint32_t maxlen;
  uint local_b0;
  value_type local_a8;
  Node *local_98;
  Node *to;
  size_t j;
  size_t c;
  vector<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>
  arcs;
  dfa_state_t *s;
  size_t i;
  Node *nil;
  size_t nc;
  string *dfa_cond_local;
  string *dfa_name_local;
  rules_t *rs_local;
  charset_t *cs_local;
  dfa_t *dfa_local;
  Skeleton *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)dfa_name);
  std::__cxx11::string::string((string *)&this->cond,(string *)dfa_cond);
  this->line = dfa_line;
  sVar6 = std::vector<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>::size(&dfa->states)
  ;
  this->nodes_count = sVar6;
  uVar7 = this->nodes_count + 1;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar7;
  uVar8 = SUB168(auVar3 * ZEXT816(0xb0),0);
  uVar16 = uVar8 + 8;
  if (0xfffffffffffffff7 < uVar8) {
    uVar16 = 0xffffffffffffffff;
  }
  if (SUB168(auVar3 * ZEXT816(0xb0),8) != 0) {
    uVar16 = 0xffffffffffffffff;
  }
  puVar9 = (ulong *)operator_new__(uVar16);
  *puVar9 = uVar7;
  pNVar15 = (Node *)(puVar9 + 1);
  if (uVar7 != 0) {
    local_140 = pNVar15;
    do {
      Node::Node(local_140);
      local_140 = local_140 + 1;
    } while (local_140 != pNVar15 + uVar7);
  }
  this->nodes = pNVar15;
  this->sizeof_key = 4;
  std::
  map<re2c::rule_rank_t,_re2c::rule_info_t,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
  ::map(&this->rules,rs);
  sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(cs);
  pNVar15 = this->nodes;
  sVar2 = this->nodes_count;
  for (s = (dfa_state_t *)0x0; s < (dfa_state_t *)this->nodes_count;
      s = (dfa_state_t *)((long)&s->arcs + 1)) {
    ppdVar10 = std::vector<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>::operator[]
                         (&dfa->states,(size_type)s);
    arcs.
    super__Vector_base<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppdVar10;
    std::
    vector<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>
    ::vector((vector<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>
              *)&c);
    j = 0;
    while (j < sVar6 - 1) {
      to = *(Node **)(&((arcs.
                         super__Vector_base<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->first->arcs)._M_t.
                       _M_impl.field_0x0 + j * 8);
      do {
        uVar7 = j + 1;
        bVar17 = false;
        if (uVar7 < sVar6 - 1) {
          bVar17 = *(Node **)((long)&((arcs.
                                       super__Vector_base<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->first->
                                     arcs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color +
                             j * 8) == to;
        }
        j = uVar7;
      } while (bVar17);
      local_178 = pNVar15 + sVar2;
      if (to != (Node *)0xffffffffffffffff) {
        local_178 = this->nodes + (long)to;
      }
      local_98 = local_178;
      __y = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](cs,uVar7);
      pVar18 = std::make_pair<re2c::Node*&,unsigned_int_const&>(&local_98,__y);
      pNStack_b8 = pVar18.first;
      local_b0 = pVar18.second;
      local_a8.first = pNStack_b8;
      local_a8.second = local_b0;
      std::
      vector<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>
      ::push_back((vector<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>
                   *)&c,&local_a8);
    }
    sVar11 = std::
             vector<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>
             ::size((vector<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>
                     *)&c);
    if ((sVar11 == 1) &&
       (pvVar12 = std::
                  vector<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>
                  ::operator[]((vector<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>
                                *)&c,0), pvVar12->first == pNVar15 + sVar2)) {
      std::
      vector<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>
      ::clear((vector<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>
               *)&c);
    }
    Node::init(this->nodes + (long)s,
               (EVP_PKEY_CTX *)
               (ulong)(*(byte *)&arcs.
                                 super__Vector_base<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage[1].first & 1));
    std::
    vector<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>
    ::~vector((vector<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>
               *)&c);
  }
  Node::calc_dist(this->nodes);
  local_bc = this->nodes->dist;
  if (local_bc != 0xfffffffe) {
    r.value = 0;
    for (local_e8 = 0; (ulong)local_e8 < this->nodes_count; local_e8 = local_e8 + 1) {
      max = this->nodes[local_e8].rule.rank.value;
      bVar17 = rule_rank_t::is_none((rule_rank_t *)&max);
      if ((!bVar17) && (bVar17 = rule_rank_t::is_def((rule_rank_t *)&max), !bVar17)) {
        local_f0 = rule_rank_t::uint32((rule_rank_t *)&max);
        puVar14 = std::max<unsigned_int>(&r.value,&local_f0);
        r.value = *puVar14;
      }
    }
    r.value = r.value + 2;
    puVar14 = std::max<unsigned_int>(&local_bc,&r.value);
    uVar1 = *puVar14;
    bVar4 = std::numeric_limits<unsigned_char>::max();
    if (bVar4 < uVar1) {
      uVar5 = std::numeric_limits<unsigned_short>::max();
      if (uVar1 <= uVar5) {
        this->sizeof_key = 2;
      }
    }
    else {
      this->sizeof_key = 1;
    }
    return;
  }
  incond((string *)&i_1,&this->cond);
  uVar13 = std::__cxx11::string::c_str();
  error("DFA path %sis too long",uVar13);
  std::__cxx11::string::~string((string *)&i_1);
  exit(1);
}

Assistant:

Skeleton::Skeleton
	( const dfa_t &dfa
	, const charset_t &cs
	, const rules_t &rs
	, const std::string &dfa_name
	, const std::string &dfa_cond
	, uint32_t dfa_line
	)
	: name (dfa_name)
	, cond (dfa_cond)
	, line (dfa_line)
	, nodes_count (dfa.states.size())
	, nodes (new Node [nodes_count + 1]) // +1 for default state
	, sizeof_key (4)
	, rules (rs)
{
	const size_t nc = cs.size() - 1;

	// initialize skeleton nodes
	Node *nil = &nodes[nodes_count];
	for (size_t i = 0; i < nodes_count; ++i)
	{
		dfa_state_t *s = dfa.states[i];
		std::vector<std::pair<Node*, uint32_t> > arcs;
		for (size_t c = 0; c < nc;)
		{
			const size_t j = s->arcs[c];
			for (;++c < nc && s->arcs[c] == j;);
			Node *to = j == dfa_t::NIL
				? nil
				: &nodes[j];
			arcs.push_back(std::make_pair(to, cs[c]));
		}
		// all arcs go to default node => this node is final, drop arcs
		if (arcs.size() == 1 && arcs[0].first == nil)
		{
			arcs.clear();
		}
		nodes[i].init(s->ctx, s->rule, arcs);
	}

	// calculate maximal path length, check overflow
	nodes->calc_dist ();
	const uint32_t maxlen = nodes->dist;
	if (maxlen == Node::DIST_MAX)
	{
		error ("DFA path %sis too long", incond (cond).c_str ());
		exit (1);
	}

	// calculate maximal rule rank (disregarding default and none rules)
	uint32_t maxrule = 0;
	for (uint32_t i = 0; i < nodes_count; ++i)
	{
		const rule_rank_t r = nodes[i].rule.rank;
		if (!r.is_none () && !r.is_def ())
		{
			maxrule = std::max (maxrule, r.uint32 ());
		}
	}
	// two upper values reserved for default and none rules)
	maxrule += 2;

	// initialize size of key
	const uint32_t max = std::max (maxlen, maxrule);
	if (max <= std::numeric_limits<uint8_t>::max())
	{
		sizeof_key = 1;
	}
	else if (max <= std::numeric_limits<uint16_t>::max())
	{
		sizeof_key = 2;
	}
}